

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

void __thiscall fmt::v11::basic_specs::set_fill<char>(basic_specs *this,basic_string_view<char> s)

{
  size_t i;
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = s.size_;
  this->data_ = (int)s.size_ << 0xf | this->data_ & 0xfffc7fff;
  if (sVar2 != 0) {
    if (sVar2 == 1) {
      this->fill_data_[0] = *s.data_;
      this->fill_data_[1] = '\0';
      this->fill_data_[2] = '\0';
      return;
    }
    sVar1 = 0;
    do {
      this->fill_data_[(uint)sVar1 & 3] = s.data_[sVar1];
      sVar1 = sVar1 + 1;
    } while (sVar2 != sVar1);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void set_fill(basic_string_view<Char> s) {
    auto size = s.size();
    set_fill_size(size);
    if (size == 1) {
      unsigned uchar = static_cast<detail::unsigned_char<Char>>(s[0]);
      fill_data_[0] = static_cast<char>(uchar);
      fill_data_[1] = static_cast<char>(uchar >> 8);
      fill_data_[2] = static_cast<char>(uchar >> 16);
      return;
    }
    FMT_ASSERT(size <= max_fill_size, "invalid fill");
    for (size_t i = 0; i < size; ++i)
      fill_data_[i & 3] = static_cast<char>(s[i]);
  }